

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> *
__thiscall
cmUVProcessChain::GetStatus
          (vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
           *__return_storage_ptr__,cmUVProcessChain *this)

{
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> _Var1;
  long lVar2;
  pointer ppSVar3;
  ulong uVar4;
  Status *pSVar5;
  allocator_type local_19;
  value_type local_18;
  
  _Var1._M_head_impl =
       (this->Data)._M_t.
       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl;
  local_18 = (value_type)0x0;
  std::vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>::
  vector(__return_storage_ptr__,
         (long)*(pointer *)((long)&(_Var1._M_head_impl)->Processes + 8) -
         *(long *)&((_Var1._M_head_impl)->Processes).
                   super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
         >> 3,&local_18,&local_19);
  ppSVar3 = (__return_storage_ptr__->
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->
      super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppSVar3) {
    uVar4 = 0;
    do {
      lVar2 = *(long *)(*(long *)&(((this->Data)._M_t.
                                    super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                                    .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>.
                                   _M_head_impl)->Processes).
                                  super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
                       + uVar4 * 8);
      pSVar5 = (Status *)(lVar2 + 0x30);
      if (*(char *)(lVar2 + 0x28) == '\0') {
        pSVar5 = (Status *)0x0;
      }
      ppSVar3[uVar4] = pSVar5;
      uVar4 = uVar4 + 1;
      ppSVar3 = (__return_storage_ptr__->
                super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
            );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const cmUVProcessChain::Status*> cmUVProcessChain::GetStatus()
  const
{
  std::vector<const cmUVProcessChain::Status*> statuses(
    this->Data->Processes.size(), nullptr);
  for (std::size_t i = 0; i < statuses.size(); i++) {
    statuses[i] = this->GetStatus(i);
  }
  return statuses;
}